

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall
QOpenGLShaderProgram::setUniformValue(QOpenGLShaderProgram *this,int location,QSizeF *size)

{
  QOpenGLFunctions *this_00;
  QSizeF *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  QOpenGLShaderProgramPrivate *d;
  GLfloat values [4];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QOpenGLShaderProgram *)0x176cfe);
  if (in_ESI != -1) {
    local_10 = 0xffffffffffffffff;
    QSizeF::width(in_RDX);
    QSizeF::height(in_RDX);
    this_00 = (QOpenGLFunctions *)&local_10;
    do {
      *(undefined4 *)this_00 = 0;
      this_00 = this_00 + 4;
    } while (this_00 != (QOpenGLFunctions *)&local_8);
    QOpenGLFunctions::glUniform2fv
              (this_00,(GLint)((ulong)&local_8 >> 0x20),(GLsizei)(QOpenGLFunctions *)&local_8,
               (GLfloat *)0x176da6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setUniformValue(int location, const QSizeF& size)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    if (location != -1) {
        GLfloat values[4] = {GLfloat(size.width()), GLfloat(size.height())};
        d->glfuncs->glUniform2fv(location, 1, values);
    }
}